

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  Select *p;
  uint uVar1;
  int iVar2;
  Expr *pEVar3;
  
  do {
    pEVar3 = pExpr;
    uVar1 = (*pWalker->xExprCallback)(pWalker,pEVar3);
    if (uVar1 != 0) {
      return uVar1 & 2;
    }
    if ((pEVar3->flags & 0x810000) != 0) {
      return 0;
    }
    if ((pEVar3->pLeft != (Expr *)0x0) && (iVar2 = walkExpr(pWalker,pEVar3->pLeft), iVar2 != 0)) {
      return 2;
    }
    pExpr = pEVar3->pRight;
  } while (pEVar3->pRight != (Expr *)0x0);
  uVar1 = pEVar3->flags;
  p = (Select *)(pEVar3->x).pList;
  if ((uVar1 >> 0xc & 1) == 0) {
    if (p != (Select *)0x0) {
      iVar2 = sqlite3WalkExprList(pWalker,(ExprList *)p);
      if (iVar2 != 0) {
        return 2;
      }
      uVar1 = pEVar3->flags;
    }
    if ((uVar1 >> 0x18 & 1) == 0) {
      return 0;
    }
    iVar2 = walkWindowList(pWalker,(pEVar3->y).pWin,1);
  }
  else {
    iVar2 = sqlite3WalkSelect(pWalker,p);
  }
  if (iVar2 == 0) {
    return 0;
  }
  return 2;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
      if( pExpr->pRight ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprUseXSelect(pExpr) ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else{
        if( pExpr->x.pList ){
          if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
        }
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pExpr, EP_WinFunc) ){
          if( walkWindowList(pWalker, pExpr->y.pWin, 1) ) return WRC_Abort;
        }
#endif
      }
    }
    break;
  }
  return WRC_Continue;
}